

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MatrixTranslate(float *result,float x,float y,float z)

{
  float local_68 [2];
  float A [16];
  float z_local;
  float y_local;
  float x_local;
  float *result_local;
  
  if (result != (float *)0x0) {
    local_68[0] = 1.0;
    local_68[1] = 0.0;
    A[0] = 0.0;
    A[1] = 0.0;
    A[2] = 0.0;
    A[3] = 1.0;
    A[4] = 0.0;
    A[5] = 0.0;
    A[6] = 0.0;
    A[7] = 0.0;
    A[8] = 1.0;
    A[9] = 0.0;
    A[0xd] = 1.0;
    A[10] = x;
    A[0xb] = y;
    A[0xc] = z;
    GPU_MultiplyAndAssign(result,local_68);
  }
  return;
}

Assistant:

void GPU_MatrixTranslate(float* result, float x, float y, float z)
{
    if(result == NULL)
		return;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				1, 0, 0, x,
				0, 1, 0, y,
				0, 0, 1, z,
				0, 0, 0, 1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				1, 0, 0, 0,
				0, 1, 0, 0,
				0, 0, 1, 0,
				x, y, z, 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}